

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

int64_t read_int(MIR_context_t ctx,char *err_msg)

{
  int iVar1;
  MIR_error_func_t p_Var2;
  int64_t iVar3;
  int c;
  char *err_msg_local;
  MIR_context_t ctx_local;
  
  iVar1 = get_byte(ctx);
  if ((iVar1 < 9) || (0x10 < iVar1)) {
    p_Var2 = MIR_get_error_func(ctx);
    (*p_Var2)(MIR_binary_io_error,err_msg);
  }
  iVar3 = get_int(ctx,iVar1 + -8);
  return iVar3;
}

Assistant:

static int64_t read_int (MIR_context_t ctx, const char *err_msg) {
  int c = get_byte (ctx);

  if (TAG_I1 > c || c > TAG_I8) MIR_get_error_func (ctx) (MIR_binary_io_error, err_msg);
  return get_int (ctx, c - TAG_I1 + 1);
}